

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

roaring64_iterator_t * roaring64_iterator_create_last(roaring64_bitmap_t *r)

{
  art_val_t *paVar1;
  roaring_container_iterator_t rVar2;
  roaring64_iterator_t *prVar3;
  ulong uVar4;
  ulong uVar5;
  uint16_t low16;
  art_iterator_t local_a8;
  
  prVar3 = (roaring64_iterator_t *)roaring_malloc(0xb0);
  prVar3->parent = r;
  art_init_iterator(&local_a8,&r->art,false);
  memcpy(&prVar3->art_it,&local_a8,0x88);
  paVar1 = (prVar3->art_it).value;
  prVar3->has_value = paVar1 != (art_val_t *)0x0;
  if (paVar1 == (art_val_t *)0x0) {
    prVar3->saturated_forward = false;
  }
  else {
    uVar4 = (ulong)*(ushort *)((prVar3->art_it).key + 4) << 0x20;
    uVar5 = (ulong)*(uint6 *)(prVar3->art_it).key;
    prVar3->high48 =
         (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8
         | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    local_a8.key[0] = '\0';
    local_a8.key[1] = '\0';
    rVar2 = container_init_iterator_last
                      (*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],(uint16_t *)&local_a8);
    (prVar3->container_it).index = rVar2.index;
    prVar3->value = (ulong)(ushort)local_a8.key._0_2_ | prVar3->high48;
    prVar3->has_value = true;
  }
  return prVar3;
}

Assistant:

roaring64_iterator_t *roaring64_iterator_create_last(
    const roaring64_bitmap_t *r) {
    roaring64_iterator_t *it =
        (roaring64_iterator_t *)roaring_malloc(sizeof(roaring64_iterator_t));
    return roaring64_iterator_init_at(r, it, /*first=*/false);
}